

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_BigNum.cpp
# Opt level: O3

bool __thiscall axl::cry::BigNum::getDecString(BigNum *this,String *string)

{
  bool bVar1;
  EVP_PKEY_CTX *dst;
  
  dst = (EVP_PKEY_CTX *)
        BN_bn2dec((BIGNUM *)
                  (this->
                  super_Handle<bignum_st_*,_axl::cry::FreeBigNum,_axl::sl::Zero<bignum_st_*>_>).m_h)
  ;
  if (dst != (EVP_PKEY_CTX *)0x0) {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy
              (string,dst,(EVP_PKEY_CTX *)0xffffffffffffffff);
    CRYPTO_free(dst);
    return true;
  }
  bVar1 = failWithLastCryptoError<bool>(false);
  return bVar1;
}

Assistant:

bool
BigNum::getDecString(sl::String* string) {
	char* p = BN_bn2dec(m_h);
	if (!p)
		return failWithLastCryptoError();

	*string = p;
	OPENSSL_free(p);
	return true;
}